

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

bool __thiscall SimpleLogger::flush(SimpleLogger *this,size_t start_pos)

{
  ofstream *fs;
  pointer pLVar1;
  pointer pLVar2;
  atomic<SimpleLoggerMgr_*> this_00;
  bool bVar3;
  CompElem *elem;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  unique_lock<std::mutex> ll;
  string local_50;
  
  ll._M_device = &this->flushingLogs;
  bVar3 = std::mutex::try_lock(ll._M_device);
  ll._M_owns = bVar3;
  if (bVar3) {
    pLVar1 = (this->logs).
             super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pLVar2 = (this->logs).
             super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>.
             _M_impl.super__Vector_impl_data._M_start;
    fs = &this->fs;
    lVar4 = start_pos * 0x1010;
    for (sVar5 = start_pos; sVar5 < (ulong)(((long)pLVar1 - (long)pLVar2) / 0x1010);
        sVar5 = sVar5 + 1) {
      LogElem::flush((LogElem *)
                     (((this->logs).
                       super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>
                       ._M_impl.super__Vector_impl_data._M_start)->ctx + lVar4 + -8),fs);
      lVar4 = lVar4 + 0x1010;
    }
    lVar4 = 0;
    while (bVar6 = start_pos != 0, start_pos = start_pos - 1, bVar6) {
      LogElem::flush((LogElem *)
                     (((this->logs).
                       super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>
                       ._M_impl.super__Vector_impl_data._M_start)->ctx + lVar4 + -8),fs);
      lVar4 = lVar4 + 0x1010;
    }
    std::ostream::flush();
    if (this->maxLogFileSize != 0) {
      lVar4 = std::ostream::tellp();
      if ((long)this->maxLogFileSize < lVar4) {
        this->curRevnum = this->curRevnum + 1;
        std::ofstream::close();
        getLogFilePath_abi_cxx11_(&local_50,this,this->curRevnum);
        std::ofstream::open((string *)fs,(_Ios_Openmode)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        this_00 = SimpleLoggerMgr::instance;
        if (SimpleLoggerMgr::instance._M_b._M_p != (__pointer_type)0x0) {
          LOCK();
          (this->numCompJobs).super___atomic_base<unsigned_int>._M_i =
               (this->numCompJobs).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
          elem = (CompElem *)operator_new(0x10);
          elem->fileNum = this->curRevnum - 1;
          elem->targetLogger = this;
          SimpleLoggerMgr::addCompElem((SimpleLoggerMgr *)this_00._M_b._M_p,elem);
        }
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&ll);
  return bVar3;
}

Assistant:

bool SimpleLogger::flush(size_t start_pos) {
    std::unique_lock<std::mutex> ll(flushingLogs, std::try_to_lock);
    if (!ll.owns_lock()) return false;

    size_t num = logs.size();
    // Circular flush into file.
    for (size_t ii=start_pos; ii<num; ++ii) {
        LogElem& ll = logs[ii];
        ll.flush(fs);
    }
    for (size_t ii=0; ii<start_pos; ++ii) {
        LogElem& ll = logs[ii];
        ll.flush(fs);
    }
    fs.flush();

    if ( maxLogFileSize &&
         fs.tellp() > (int64_t)maxLogFileSize ) {
        // Exceeded limit, make a new file.
        curRevnum++;
        fs.close();
        fs.open(getLogFilePath(curRevnum), std::ofstream::out | std::ofstream::app);

        // Compress it (tar gz). Register to the global queue.
        SimpleLoggerMgr* mgr = SimpleLoggerMgr::getWithoutInit();
        if (mgr) {
            numCompJobs.fetch_add(1);
            SimpleLoggerMgr::CompElem* elem =
                new SimpleLoggerMgr::CompElem(curRevnum-1, this);
            mgr->addCompElem(elem);
        }
    }

    return true;
}